

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPChunk * ChunkSearchList(WebPChunk *first,uint32_t nth,uint32_t tag)

{
  WebPChunk *pWVar1;
  uint32_t uVar2;
  uint32_t iter;
  WebPChunk *pWVar3;
  
  for (; (first != (WebPChunk *)0x0 && (first->tag_ != tag)); first = first->next_) {
  }
  uVar2 = nth;
  if (first == (WebPChunk *)0x0) {
    return (WebPChunk *)0x0;
  }
  do {
    pWVar3 = first;
    uVar2 = uVar2 - 1;
    if (uVar2 == 0) break;
    for (first = pWVar3->next_; (first != (WebPChunk *)0x0 && (first->tag_ != tag));
        first = first->next_) {
    }
  } while (first != (WebPChunk *)0x0);
  pWVar1 = (WebPChunk *)0x0;
  if (uVar2 == 0) {
    pWVar1 = pWVar3;
  }
  if (nth == 0) {
    pWVar1 = pWVar3;
  }
  return pWVar1;
}

Assistant:

WebPChunk* ChunkSearchList(WebPChunk* first, uint32_t nth, uint32_t tag) {
  uint32_t iter = nth;
  first = ChunkSearchNextInList(first, tag);
  if (first == NULL) return NULL;

  while (--iter != 0) {
    WebPChunk* next_chunk = ChunkSearchNextInList(first->next_, tag);
    if (next_chunk == NULL) break;
    first = next_chunk;
  }
  return ((nth > 0) && (iter > 0)) ? NULL : first;
}